

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# euc_jp.c
# Opt level: O2

int is_code_ctype(OnigCodePoint code,uint ctype)

{
  uint uVar1;
  
  uVar1 = 0;
  if (ctype < 0xf && code < 0x100) {
    uVar1 = (uint)((EncISO_8859_16_CtypeTable[code] >> (ctype & 0x1f) & 1) != 0);
  }
  return uVar1;
}

Assistant:

static int
is_code_ctype(OnigCodePoint code, unsigned int ctype)
{
  if (ctype <= ONIGENC_MAX_STD_CTYPE) {
    if (code < 128)
      return ONIGENC_IS_ASCII_CODE_CTYPE(code, ctype);
    else {
      if (CTYPE_IS_WORD_GRAPH_PRINT(ctype)) {
        return (code_to_mbclen(code) > 1 ? TRUE : FALSE);
      }
    }
  }
  else {
    ctype -= (ONIGENC_MAX_STD_CTYPE + 1);
    if (ctype >= (unsigned int )(sizeof(PropertyList)/sizeof(PropertyList[0])))
      return ONIGERR_TYPE_BUG;

    return onig_is_in_code_range((UChar* )PropertyList[ctype], code);
  }

  return FALSE;
}